

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::ANN(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  Shape SVar1;
  const_iterator puVar2;
  anon_union_8_2_1e237852_for_Shape_0 aVar3;
  const_iterator puVar4;
  Matrix *pMVar5;
  undefined1 local_80 [8];
  Layer layer;
  const_iterator it_1;
  const_iterator it;
  initializer_list<unsigned_int> *n_perceptrons_local;
  ANN *this_local;
  
  this->learning_rate = 0.01;
  std::vector<Layer,_std::allocator<Layer>_>::vector(&this->m_layers);
  this->m_dataSet = (DataSet *)0x0;
  this->m_batchSize = 1;
  this->m_lr = this->learning_rate;
  std::initializer_list<unsigned_int>::begin(n_perceptrons);
  puVar2 = std::initializer_list<unsigned_int>::begin(n_perceptrons);
  this->m_n_input = *puVar2;
  puVar2 = std::initializer_list<unsigned_int>::end(n_perceptrons);
  this->m_n_output = puVar2[-1];
  this->m_batchSize = 1;
  layer.m_biases.m_shape.field_0 =
       (anon_union_8_2_1e237852_for_Shape_0)
       std::initializer_list<unsigned_int>::begin(n_perceptrons);
  while( true ) {
    SVar1.field_0 = layer.m_biases.m_shape.field_0;
    aVar3 = (anon_union_8_2_1e237852_for_Shape_0)
            std::initializer_list<unsigned_int>::end(n_perceptrons);
    if (SVar1.field_0 == aVar3) break;
    Layer::Layer((Layer *)local_80);
    Layer::add_perceptron((Layer *)local_80,*(uint *)layer.m_biases.m_shape.field_0);
    puVar2 = (const_iterator)((long)layer.m_biases.m_shape.field_0 + 4);
    puVar4 = std::initializer_list<unsigned_int>::end(n_perceptrons);
    if (puVar2 != puVar4) {
      pMVar5 = Layer::weights((Layer *)local_80);
      Matrix::set_shape(pMVar5,*(uint *)((long)layer.m_biases.m_shape.field_0 + 4),
                        *(uint *)layer.m_biases.m_shape.field_0);
      pMVar5 = Layer::weights((Layer *)local_80);
      Matrix::random_init(pMVar5,-1.0,1.0);
      pMVar5 = Layer::biases((Layer *)local_80);
      Matrix::set_shape(pMVar5,1,*(uint *)((long)layer.m_biases.m_shape.field_0 + 4));
      pMVar5 = Layer::biases((Layer *)local_80);
      Matrix::random_init(pMVar5,-1.0,1.0);
    }
    std::vector<Layer,_std::allocator<Layer>_>::push_back(&this->m_layers,(value_type *)local_80);
    Layer::~Layer((Layer *)local_80);
    layer.m_biases.m_shape.field_0 =
         (anon_union_8_2_1e237852_for_Shape_0)((long)layer.m_biases.m_shape.field_0 + 4);
  }
  return;
}

Assistant:

ANN::ANN(const std::initializer_list<uint>& n_perceptrons){
    auto it=n_perceptrons.begin();
    m_n_input=*n_perceptrons.begin();
    m_n_output=*(n_perceptrons.end()-1);
    m_batchSize=1;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        Layer layer;
        layer.add_perceptron(*it);
        if(it+1!=n_perceptrons.end()){
            layer.weights().set_shape(*(it+1), *it);
            layer.weights().random_init(-1., 1.);
            layer.biases().set_shape(1, *(it+1));
            layer.biases().random_init(-1., 1.);
        }
        m_layers.push_back(layer);
    }
}